

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

Tree smergetree(Tree t1,Tree t2,int *o1,int *o2,int cx,int cy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  Branch *pBVar8;
  ulong uVar9;
  Branch *pBVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  Branch *__ptr;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  Branch *__ptr_00;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  Tree t;
  Tree TVar28;
  int map [1000];
  int o [1000];
  
  __ptr = t2.branch;
  __ptr_00 = t1.branch;
  iVar6 = t2.deg;
  iVar20 = iVar6 + -1;
  uVar4 = t1.deg;
  TVar28.deg = iVar6 + -1 + uVar4;
  t.length = 0;
  t.deg = TVar28.deg;
  lVar7 = (long)(int)(TVar28.deg * 2 + -2);
  pBVar8 = (Branch *)malloc(lVar7 * 0xc);
  iVar25 = uVar4 * 2 + -2;
  uVar16 = 0;
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
  }
  for (piVar13 = &__ptr_00->y;
      (uVar17 = uVar9, uVar9 != uVar16 &&
      ((((Branch *)(piVar13 + -1))->x != cx || (uVar17 = uVar16, *piVar13 != cy))));
      piVar13 = piVar13 + 3) {
    uVar16 = uVar16 + 1;
  }
  iVar15 = __ptr_00[uVar17].n;
  if ((__ptr_00[iVar15].x != cx) || (iVar18 = iVar25, __ptr_00[iVar15].y != cy)) {
    pBVar10 = __ptr_00 + uVar17;
    iVar14 = iVar25 + iVar20;
    iVar15 = pBVar10->n;
    pBVar8[iVar14].n = iVar15;
    iVar18 = pBVar10->y;
    pBVar8[iVar14].x = pBVar10->x;
    pBVar8[iVar14].y = iVar18;
    pBVar8[iVar14].n = iVar15 + iVar20;
    pBVar10->n = iVar25;
    iVar18 = uVar4 * 2 + -1;
    iVar15 = iVar25;
  }
  lVar21 = (long)(iVar6 * 2 + -2);
  lVar19 = (long)iVar6;
  for (lVar11 = lVar19; lVar11 < lVar21; lVar11 = lVar11 + 1) {
    map[lVar11] = -1;
  }
  uVar16 = 0;
  uVar9 = 0;
  if (0 < iVar6) {
    uVar9 = t2._0_8_ & 0xffffffff;
  }
  piVar13 = &__ptr->y;
  do {
    uVar17 = uVar9;
    if (uVar9 == uVar16) {
LAB_001260c5:
      uVar16 = (ulong)__ptr[uVar9].n;
      uVar26 = (uint)uVar17;
      if ((__ptr[uVar16].x != cx) || (uVar5 = __ptr[uVar9].n, __ptr[uVar16].y != cy)) {
        uVar5 = uVar26;
      }
      uVar9 = uVar16;
      uVar24 = __ptr[uVar16].n;
      do {
        uVar1 = __ptr[(int)uVar24].n;
        __ptr[(int)uVar24].n = (int)uVar9;
        uVar9 = (ulong)uVar24;
        bVar27 = uVar24 != uVar1;
        uVar24 = uVar1;
      } while (bVar27);
      __ptr[uVar16].n = uVar5;
      lVar22 = (long)(int)uVar5;
      for (lVar11 = lVar19; lVar11 < lVar21; lVar11 = lVar11 + 1) {
        if (lVar22 != lVar11) {
          map[lVar11] = iVar18;
          iVar18 = iVar18 + 1;
        }
      }
      map[lVar22] = iVar15;
      uVar16 = (ulong)(uVar26 == 0);
      lVar11 = (long)(int)uVar4;
      uVar9 = 0;
      uVar5 = 0;
      do {
        lVar12 = (long)(int)uVar5;
        iVar14 = (int)uVar16;
        iVar15 = (int)uVar9;
        if (iVar14 < iVar6) {
          if (iVar15 < (int)uVar4) {
            iVar2 = o1[iVar15];
            iVar3 = o2[iVar14];
            pBVar10 = pBVar8 + lVar12;
            if (iVar2 < iVar3) {
              iVar14 = __ptr_00[iVar15].y;
              pBVar10->x = __ptr_00[iVar15].x;
              pBVar10->y = iVar14;
              pBVar10->n = __ptr_00[iVar15].n + iVar20;
              o[lVar12] = iVar2;
              uVar5 = uVar5 + 1;
              uVar9 = (ulong)(iVar15 + 1);
            }
            else {
              iVar15 = __ptr[iVar14].y;
              pBVar10->x = __ptr[iVar14].x;
              pBVar10->y = iVar15;
              pBVar10->n = map[__ptr[iVar14].n] + iVar20;
              o[lVar12] = iVar3;
              uVar5 = uVar5 + 1;
              uVar24 = iVar14 + 2;
              if (iVar14 + 1U != uVar26) {
                uVar24 = iVar14 + 1U;
              }
              uVar16 = (ulong)uVar24;
            }
          }
          else {
            uVar16 = (ulong)iVar14;
            piVar13 = &__ptr[uVar16].n;
            for (; (long)uVar16 < lVar19; uVar16 = uVar16 + 1) {
              if ((long)(int)uVar26 != uVar16) {
                iVar15 = ((Branch *)(piVar13 + -2))->y;
                pBVar8[(int)uVar5].x = ((Branch *)(piVar13 + -2))->x;
                pBVar8[(int)uVar5].y = iVar15;
                pBVar8[(int)uVar5].n = map[*piVar13] + iVar20;
                o[(int)uVar5] = o2[uVar16];
                uVar5 = uVar5 + 1;
              }
              piVar13 = piVar13 + 3;
            }
          }
        }
        else {
          piVar13 = o + lVar12;
          lVar23 = 2;
          uVar17 = (ulong)iVar15;
          for (uVar9 = uVar17; (long)uVar9 < lVar11; uVar9 = uVar9 + 1) {
            *(undefined8 *)((long)pBVar8 + lVar23 * 4 + lVar12 * 0xc + -8) =
                 *(undefined8 *)((long)__ptr_00 + lVar23 * 4 + uVar17 * 0xc + -8);
            (&pBVar8[lVar12].x)[lVar23] = (&__ptr_00[uVar17].x)[lVar23] + iVar20;
            *piVar13 = o1[uVar9];
            uVar5 = uVar5 + 1;
            lVar23 = lVar23 + 3;
            piVar13 = piVar13 + 1;
          }
        }
      } while (((int)uVar9 < (int)uVar4) || ((int)uVar16 < iVar6));
      uVar16 = 0;
      uVar9 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar9 = uVar16;
      }
      for (; uVar9 != uVar16; uVar16 = uVar16 + 1) {
        o1[uVar16] = o[uVar16];
      }
      lVar12 = (long)iVar20;
      lVar23 = lVar11 * 0xc + 8;
      for (; lVar11 < iVar25; lVar11 = lVar11 + 1) {
        *(undefined8 *)((long)pBVar8 + lVar23 + lVar12 * 0xc + -8) =
             *(undefined8 *)((long)__ptr_00 + lVar23 + -8);
        *(int *)((long)&pBVar8[lVar12].x + lVar23) = *(int *)((long)&__ptr_00->x + lVar23) + iVar20;
        lVar23 = lVar23 + 0xc;
      }
      piVar13 = &__ptr[lVar19].n;
      for (; lVar19 < lVar21; lVar19 = lVar19 + 1) {
        if (lVar22 != lVar19) {
          lVar11 = map[lVar19] + lVar12;
          pBVar8[lVar11].n = *piVar13;
          iVar6 = ((Branch *)(piVar13 + -2))->y;
          pBVar8[lVar11].x = ((Branch *)(piVar13 + -2))->x;
          pBVar8[lVar11].y = iVar6;
          pBVar8[lVar11].n = map[*piVar13] + iVar20;
        }
        piVar13 = piVar13 + 3;
      }
      lVar11 = (long)(iVar18 + iVar20);
      piVar13 = &pBVar8[lVar11].n;
      for (; lVar11 < lVar7; lVar11 = lVar11 + 1) {
        iVar6 = __ptr->y;
        ((Branch *)(piVar13 + -2))->x = __ptr->x;
        ((Branch *)(piVar13 + -2))->y = iVar6;
        *piVar13 = (int)lVar11;
        piVar13 = piVar13 + 3;
      }
      free(__ptr_00);
      free(__ptr);
      t.branch = pBVar8;
      iVar6 = wirelength(t);
      TVar28.length = iVar6;
      TVar28.branch = pBVar8;
      return TVar28;
    }
    if ((((Branch *)(piVar13 + -1))->x == cx) && (*piVar13 == cy)) {
      uVar9 = uVar16;
      uVar17 = uVar16 & 0xffffffff;
      goto LAB_001260c5;
    }
    uVar16 = uVar16 + 1;
    piVar13 = piVar13 + 3;
  } while( true );
}

Assistant:

Tree smergetree(Tree t1, Tree t2, int *o1, int *o2,
		DTYPE cx, DTYPE cy)
{
  Tree t;
  int d, i, j, k, n, ci, cn, mapped_cn, prev, curr, next, offset;
#if MR_FOR_SMALL_CASES_ONLY
  int o[D2M+MAXPART], map[2*D2M];
#else
  int *o, *map;

  map = (int*)malloc(sizeof(int)*(t1.deg+t2.deg)*2);
  o = (int*)malloc(sizeof(int)*(t1.deg+t2.deg+MAXPART2));  
#endif

  t.deg = t1.deg + t2.deg - 1;
  t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));

  offset = t2.deg - 1;
  d = t1.deg*2-2;

  for (i=0; i<t1.deg; i++) {
    if (t1.branch[i].x==cx && t1.branch[i].y==cy) {
      break;
    }
  }
  n = t1.branch[i].n;
  if (t1.branch[n].x==cx && t1.branch[n].y==cy) {
    mapped_cn = n;
  } else {
    t.branch[d+offset] = t1.branch[i];
    t.branch[d+offset].n += offset;
    t1.branch[i].n = d;
    mapped_cn = d;
    d++;
  }

  for (i=t2.deg; i<t2.deg*2-2; i++) {
    map[i] = -1;
  }
  for (i=0; i<t2.deg; i++) {
    if (t2.branch[i].x==cx && t2.branch[i].y==cy) {
      ci = i;
      break;
    }
  }

  n = t2.branch[i].n;

  if (t2.branch[n].x==cx && t2.branch[n].y==cy) {
    cn = n;
  } else {
    cn = i;
  }

  prev = n;
  curr = t2.branch[n].n;
  next = t2.branch[curr].n;
  while (curr != next) {
    t2.branch[curr].n = prev;
    prev = curr;
    curr = next;
    next = t2.branch[curr].n;
  }
  t2.branch[curr].n = prev;
  t2.branch[n].n = cn;

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i!=cn) {
      map[i] = d++;
    }
  }
  map[cn] = mapped_cn;

  /* merge the pin nodes in the correct order */
  j = i = k = 0;
  if (k==ci) { k++; }

  do {
    if (k>=t2.deg) {
      for (; i<t1.deg; i++) {
	t.branch[j] = t1.branch[i];
	t.branch[j].n = t1.branch[i].n + offset;
	o[j] = o1[i];
	j++;
      }
    } else if (i>=t1.deg) {
      for (; k<t2.deg; k++) {
	if (k==ci) {
	  continue;
	}
	t.branch[j] = t2.branch[k];
	n = t2.branch[k].n;
	t.branch[j].n = map[n] + offset;
	o[j] = o2[k];
	j++;
      }
    } else if (o1[i] < o2[k]) {
      t.branch[j] = t1.branch[i];
      t.branch[j].n = t1.branch[i].n + offset;
      o[j] = o1[i];
      j++;
      i++;
    } else {
      t.branch[j] = t2.branch[k];
      n = t2.branch[k].n;
      t.branch[j].n = map[n] + offset;
      o[j] = o2[k];
      j++;
      k++;
      if (k==ci) { k++; }
    }
  }while (i<t1.deg || k<t2.deg);
  //assert(j==t.deg);

  for (i=0; i<j; i++) {
    o1[i] = o[i];
  }

  for (i=t1.deg; i<t1.deg*2-2; i++) {
    t.branch[i+offset] = t1.branch[i];
    t.branch[i+offset].n = t1.branch[i].n + offset;
  }

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i != cn) {
      t.branch[map[i]+offset] = t2.branch[i];
      n = t2.branch[i].n;
      t.branch[map[i]+offset].n = map[n] + offset;
    }
  }

  for (i=d+offset; i<t.deg*2-2; i++) {
    t.branch[i] = t2.branch[0];
    t.branch[i].n = i;
  }

  free(t1.branch);
  free(t2.branch);

  t.length = wirelength(t);

#if !(MR_FOR_SMALL_CASES_ONLY)
  free(map); free(o);
#endif
  return t;
}